

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.h
# Opt level: O0

void __thiscall HFactor::clinkDel(HFactor *this,int index)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  int in_ESI;
  long in_RDI;
  int xnext;
  int xlast;
  
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x278),(long)in_ESI);
  iVar1 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x260),(long)in_ESI);
  iVar2 = *pvVar3;
  if (iVar1 < 0) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x248),(long)(-2 - iVar1));
    *pvVar3 = iVar2;
  }
  else {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x260),(long)iVar1);
    *pvVar3 = iVar2;
  }
  if (-1 < iVar2) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x278),(long)iVar2);
    *pvVar3 = iVar1;
  }
  return;
}

Assistant:

void clinkDel(const int index) {
        const int xlast = clinkLast[index];
        const int xnext = clinkNext[index];
        if (xlast >= 0)
            clinkNext[xlast] = xnext;
        else
            clinkFirst[-xlast - 2] = xnext;
        if (xnext >= 0)
            clinkLast[xnext] = xlast;
    }